

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::Shell__GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,char *in,int flags)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  cmStateSnapshot *pcVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  cmOutputConverter *pcVar8;
  uint flags_00;
  char cVar9;
  int iVar10;
  bool bVar11;
  
  flags_00 = (uint)in;
  bVar3 = (byte)in;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  iVar6 = Shell__ArgumentNeedsQuotes((char *)this,flags_00);
  cVar9 = (char)__return_storage_ptr__;
  if (iVar6 != 0) {
    if (((char)bVar3 < '\0') && ((flags_00 >> 8 & 1) != 0)) {
      std::__cxx11::string::push_back(cVar9);
    }
    std::__cxx11::string::push_back(cVar9);
  }
  if (*(char *)&(this->StateSnapshot).State == '\0') {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      if (((ulong)in & 0x40) != 0) {
        pcVar8 = (cmOutputConverter *)Shell__SkipMakeVariables((char *)this);
        if (pcVar8 == this) {
          bVar11 = true;
        }
        else {
          for (; this != pcVar8;
              this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1)) {
            std::__cxx11::string::push_back(cVar9);
          }
          bVar11 = *(char *)&(this->StateSnapshot).State != '\0';
          uVar7 = 0;
        }
        if (!bVar11) break;
      }
      uVar5 = uVar7;
      if ((flags_00 >> 8 & 1) == 0) {
        if (((ulong)in & 4) == 0) {
          cVar1 = *(char *)&(this->StateSnapshot).State;
          if (cVar1 == '\\') {
            uVar5 = uVar7 + 1;
          }
          else {
            uVar5 = 0;
            if (cVar1 == '\"') {
              iVar10 = uVar7 + 1;
              while (iVar10 = iVar10 + -1, 0 < iVar10) {
                std::__cxx11::string::push_back(cVar9);
              }
              std::__cxx11::string::push_back(cVar9);
              uVar5 = (int)uVar7 >> 0x1f & uVar7;
            }
          }
        }
      }
      else {
        uVar7 = *(byte *)&(this->StateSnapshot).State - 0x22;
        if ((uVar7 < 0x3f) && ((0x4400000000000005U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
          std::__cxx11::string::push_back(cVar9);
        }
      }
      uVar7 = uVar5;
      bVar2 = *(byte *)&(this->StateSnapshot).State;
      if (bVar2 < 0x25) {
        if (bVar2 == 0x23) {
          if ((flags_00 & 9) != 9) goto LAB_001dbc0a;
          goto LAB_001dbc37;
        }
        if ((bVar2 == 0x24) && (((ulong)in & 3) != 0)) goto LAB_001dbc37;
LAB_001dbc0a:
        std::__cxx11::string::push_back(cVar9);
      }
      else {
        if (bVar2 == 0x25) {
          if ((((ulong)in & 0x30) != 0 & bVar3) == 0 && (char)((flags_00 & 2) >> 1) == '\0')
          goto LAB_001dbc0a;
        }
        else if ((bVar2 != 0x3b) || (((ulong)in & 2) == 0)) goto LAB_001dbc0a;
LAB_001dbc37:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pcVar4 = &this->StateSnapshot;
      this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1);
    } while (*(char *)((long)&pcVar4->State + 1) != '\0');
  }
  if (iVar6 != 0) {
    iVar6 = uVar7 + 1;
    while (iVar6 = iVar6 + -1, 0 < iVar6) {
      std::__cxx11::string::push_back(cVar9);
    }
    if ((-1 < (char)bVar3) || (std::__cxx11::string::push_back(cVar9), (flags_00 >> 8 & 1) != 0)) {
      std::__cxx11::string::push_back(cVar9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Shell__GetArgument(const char* in, int flags)
{
  /* Output will be at least as long as input string.  */
  std::string out;
  out.reserve(strlen(in));

  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell__ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
      out += '\'';
    } else {
      out += '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (c = in; *c; ++c) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      const char* skip = Shell__SkipMakeVariables(c);
      if (skip != c) {
        /* Copy to the end of the make variable references.  */
        while (c != skip) {
          out += *c++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (!*c) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*c == '\\' || *c == '"' || *c == '`' || *c == '$') {
        /* This character needs a backslash to escape it.  */
        out += '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*c == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*c == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out += '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out += '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*c == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out += "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out += "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out += '$';
      }
    } else if (*c == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out += "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out += '#';
      }
    } else if (*c == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out += "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out += '%';
      }
    } else if (*c == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out += "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out += ';';
      }
    } else {
      /* Store this character.  */
      out += *c;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out += '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out += '\'';
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
    } else {
      out += '"';
    }
  }

  return out;
}